

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O3

bool Assimp::Ogre::OgreXmlSerializer::ImportSkeleton(IOSystem *pIOHandler,MeshXml *mesh)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  Skeleton *this;
  OgreXmlSerializer serializer;
  XmlReaderPtr reader;
  undefined1 local_60 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  XmlReader *local_38;
  _Alloc_hider local_30;
  
  if ((mesh == (MeshXml *)0x0) || ((mesh->skeletonRef)._M_string_length == 0)) {
    bVar3 = false;
  }
  else {
    pcVar1 = local_60 + 0x10;
    local_60._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,".skeleton","");
    bVar3 = EndsWith(&mesh->skeletonRef,(string *)local_60,false);
    if ((pointer)local_60._0_8_ != pcVar1) {
      operator_delete((void *)local_60._0_8_);
    }
    if (bVar3) {
      bVar3 = OgreBinarySerializer::ImportSkeleton(pIOHandler,mesh);
      if (bVar3) {
        return true;
      }
      pcVar2 = (mesh->skeletonRef)._M_dataplus._M_p;
      local_60._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar2,pcVar2 + (mesh->skeletonRef)._M_string_length);
      std::__cxx11::string::append((char *)local_60);
      std::__cxx11::string::operator=((string *)mesh,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar1) {
        operator_delete((void *)local_60._0_8_);
      }
    }
    OpenReader((OgreXmlSerializer *)&local_38,pIOHandler,&mesh->skeletonRef);
    bVar3 = local_38 != (XmlReader *)0x0;
    if (bVar3) {
      this = (Skeleton *)operator_new(0x38);
      Skeleton::Skeleton(this);
      local_60._0_8_ = local_38;
      local_60._16_8_ = 0;
      local_48._M_local_buf[0] = '\0';
      local_60._8_8_ = &local_48;
      ReadSkeleton((OgreXmlSerializer *)local_60,this);
      mesh->skeleton = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._8_8_ != &local_48) {
        operator_delete((void *)local_60._8_8_);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_p);
    }
  }
  return bVar3;
}

Assistant:

bool OgreXmlSerializer::ImportSkeleton(Assimp::IOSystem *pIOHandler, MeshXml *mesh)
{
    if (!mesh || mesh->skeletonRef.empty())
        return false;

    // Highly unusual to see in read world cases but support
    // XML mesh referencing a binary skeleton file.
    if (EndsWith(mesh->skeletonRef, ".skeleton", false))
    {
        if (OgreBinarySerializer::ImportSkeleton(pIOHandler, mesh))
            return true;

        /** Last fallback if .skeleton failed to be read. Try reading from
            .skeleton.xml even if the XML file referenced a binary skeleton.
            @note This logic was in the previous version and I don't want to break
            old code that might depends on it. */
        mesh->skeletonRef = mesh->skeletonRef + ".xml";
    }

    XmlReaderPtr reader = OpenReader(pIOHandler, mesh->skeletonRef);
    if (!reader.get())
        return false;

    Skeleton *skeleton = new Skeleton();
    OgreXmlSerializer serializer(reader.get());
    serializer.ReadSkeleton(skeleton);
    mesh->skeleton = skeleton;
    return true;
}